

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setDecimalFormatSymbols(DecimalFormat *this,DecimalFormatSymbols *symbols)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatSymbols *pDVar2;
  uint in_EAX;
  DecimalFormatSymbols *this_00;
  UErrorCode localStatus;
  undefined8 uStack_28;
  
  pDVar1 = this->fields;
  uStack_28._0_4_ = in_EAX;
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)symbols);
  if (this_00 == (DecimalFormatSymbols *)0x0) {
    this_00 = (DecimalFormatSymbols *)0x0;
  }
  else {
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,symbols);
  }
  pDVar2 = (pDVar1->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
  if (pDVar2 != (DecimalFormatSymbols *)0x0) {
    (*(pDVar2->super_UObject)._vptr_UObject[1])();
  }
  (pDVar1->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr = this_00;
  uStack_28 = (ulong)(uint)uStack_28;
  touch(this,(UErrorCode *)((long)&uStack_28 + 4));
  return;
}

Assistant:

void DecimalFormat::setDecimalFormatSymbols(const DecimalFormatSymbols& symbols) {
    fields->symbols.adoptInstead(new DecimalFormatSymbols(symbols));
    touchNoError();
}